

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O1

void pbrt::pbrt2obj(int ac,char **av)

{
  enable_shared_from_this<pbrt::Entity> *peVar1;
  char *__s;
  element_type *peVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  runtime_error *prVar6;
  element_type *this;
  int iVar7;
  long *plVar8;
  bool bVar9;
  runtime_error e;
  string arg;
  string inFileName;
  string outFileName;
  long *local_f8;
  element_type *peStack_f0;
  long local_e8;
  long lStack_e0;
  undefined1 local_d8 [56];
  string local_a0;
  SP local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_70._M_pi = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"a.obj","");
  if (1 < ac) {
    iVar7 = 1;
    do {
      std::__cxx11::string::string((string *)local_d8,av[iVar7],(allocator *)&local_f8);
      if (*(char *)local_d8._0_8_ == '-') {
        iVar3 = std::__cxx11::string::compare((char *)local_d8);
        peVar2 = local_68;
        if (iVar3 != 0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"invalid argument \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_f8 = (long *)*plVar5;
          plVar8 = plVar5 + 2;
          if (local_f8 == plVar8) {
            local_e8 = *plVar8;
            lStack_e0 = plVar5[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar8;
          }
          peStack_f0 = (element_type *)plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::runtime_error::runtime_error(prVar6,(string *)&local_f8);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __s = av[(long)iVar7 + 1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)peVar2,(ulong)__s);
        iVar7 = iVar7 + 1;
      }
      else {
        std::__cxx11::string::_M_assign((string *)(local_d8 + 0x38));
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < ac);
  }
  plVar5 = (long *)(local_d8 + 0x10);
  std::ofstream::open((string *)out,(_Ios_Openmode)&local_70);
  defineDefaultMaterials((ofstream *)out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------------------------",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parsing: ",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,".pbrt","");
  std::__cxx11::string::substr((ulong)local_d8,(ulong)(local_d8 + 0x38));
  if ((element_type *)local_d8._8_8_ == peStack_f0) {
    if ((element_type *)local_d8._8_8_ == (element_type *)0x0) {
      bVar9 = true;
    }
    else {
      iVar7 = bcmp((void *)local_d8._0_8_,local_f8,local_d8._8_8_);
      bVar9 = iVar7 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if ((long *)local_d8._0_8_ != plVar5) {
    operator_delete((void *)local_d8._0_8_);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (bVar9) {
    local_d8._0_8_ = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
    importPBRT((pbrt *)&local_f8,(string *)(local_d8 + 0x38),(string *)local_d8);
    this = peStack_f0;
    plVar8 = local_f8;
    peStack_f0 = (element_type *)0x0;
    local_f8 = (long *)0x0;
    if ((long *)local_d8._0_8_ != plVar5) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,".pbf","");
    std::__cxx11::string::substr((ulong)local_d8,(ulong)(local_d8 + 0x38));
    if ((element_type *)local_d8._8_8_ == peStack_f0) {
      if ((element_type *)local_d8._8_8_ == (element_type *)0x0) {
        bVar9 = true;
      }
      else {
        iVar7 = bcmp((void *)local_d8._0_8_,local_f8,local_d8._8_8_);
        bVar9 = iVar7 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((long *)local_d8._0_8_ != plVar5) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (!bVar9) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"un-recognized input file extension");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Scene::loadFrom((Scene *)local_d8,(string *)(local_d8 + 0x38));
    this = (element_type *)local_d8._8_8_;
    plVar8 = (long *)local_d8._0_8_;
    local_d8._0_8_ = (long *)0x0;
    local_d8._8_8_ = (element_type *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," => yay! parsing successful...",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"done parsing, now exporting (triangular geometry from) scene",
             0x3c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar8[0xe];
  local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[0xf];
  if ((element_type *)
      local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(((element_type *)
                 local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->super_Entity).super_enable_shared_from_this<pbrt::Entity>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).
                    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(((element_type *)
                 local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->super_Entity).super_enable_shared_from_this<pbrt::Entity>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).
                    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_d8._0_8_ = (pointer)0x3f800000;
  local_d8._8_8_ = (element_type *)0x0;
  local_d8._16_8_ = 0x3f800000;
  local_d8._24_8_ = 0;
  local_d8._32_8_ = (pointer)0x3f800000;
  local_d8._40_8_ = (pointer)0x0;
  writeObject(&local_80,(affine3f *)local_d8);
  if ((element_type *)
      local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (this != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if (local_70._M_pi != &local_60) {
    operator_delete(local_70._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void pbrt2obj(int ac, char **av)
  {
    std::string inFileName;
    std::string outFileName = "a.obj";
    for (int i=1;i<ac;i++) {
      const std::string arg = av[i];
      if (arg[0] == '-') {
        if (arg == "-o")
          outFileName = av[++i];
        else
          throw std::runtime_error("invalid argument '"+arg+"'");
      } else {
        inFileName = arg;
      }          
    }
    out.open(outFileName);
    // out = fopen(outFileName.c_str(),"w");
    assert(out.good());

    defineDefaultMaterials(out);
    
  
    std::cout << "-------------------------------------------------------" << std::endl;
    std::cout << "parsing: " << inFileName << std::endl;
      
    std::shared_ptr<Scene> scene;
    try {
      if (endsWith(inFileName,".pbrt"))
        scene = importPBRT(inFileName);
      else if (endsWith(inFileName,".pbf"))
        scene = Scene::loadFrom(inFileName);
      else
        throw std::runtime_error("un-recognized input file extension");
        
      std::cout << " => yay! parsing successful..." << std::endl;
        
      std::cout << "done parsing, now exporting (triangular geometry from) scene" << std::endl;
      writeObject(scene->world,affine3f::identity());
    } catch (std::runtime_error e) {
      std::cerr << "**** ERROR IN PARSING ****" << std::endl << e.what() << std::endl;
      std::cerr << "(this means that either there's something wrong with that PBRT file, or that the parser can't handle it)" << std::endl;
      exit(1);
    }
  }